

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffDomain<0>::check(AllDiffDomain<0> *this)

{
  uint uVar1;
  IntView<0> *pIVar2;
  uint uVar3;
  void *__s;
  long lVar4;
  ulong __n;
  byte bVar5;
  long lVar6;
  
  uVar1 = this->sz;
  __n = (ulong)uVar1;
  if (__n == 0) {
    bVar5 = 1;
  }
  else {
    uVar3 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = uVar1;
    }
    __s = operator_new__((long)(int)uVar3);
    if ((int)uVar1 < 1) {
      bVar5 = 1;
    }
    else {
      lVar6 = 0;
      memset(__s,0,__n);
      pIVar2 = this->x;
      do {
        lVar4 = *(long *)((long)&pIVar2->var + lVar6);
        lVar4 = (long)*(int *)(lVar4 + 0xc + (ulong)*(byte *)(lVar4 + 0x20) * 0x10);
        bVar5 = *(byte *)((long)__s + lVar4);
        if (bVar5 != 0) break;
        *(undefined1 *)((long)__s + lVar4) = 1;
        lVar6 = lVar6 + 0x10;
      } while (__n << 4 != lVar6);
      bVar5 = bVar5 ^ 1;
    }
    operator_delete__(__s);
  }
  return (bool)bVar5;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}